

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O2

double __thiscall ON_OutlineFigure::AreaEstimate(ON_OutlineFigure *this)

{
  ON_OutlineFigurePoint *pOVar1;
  ON_OutlineFigurePoint *pOVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  ON__UINT32 OVar5;
  uint uVar6;
  double (*padVar7) [3];
  double (*padVar8) [4];
  int cvdex;
  uint uVar9;
  long lVar10;
  int tdex;
  long lVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined8 in_XMM1_Qb;
  double dVar12;
  double dVar13;
  ON_2dPoint OVar14;
  ON_2dPoint local_218;
  double local_200;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  double local_1e0;
  ON_OutlineFigurePoint p;
  undefined1 local_1c8 [16];
  ON_2dPoint local_1a0;
  ON_2dPoint local_190;
  ON_2dPoint local_180;
  ON_2dPoint local_170;
  ON_OutlineFigurePoint figure_start;
  ON_2dPoint local_148;
  ON_2dPoint local_138;
  ON_2dPoint cv [4];
  double quad [3] [3];
  double dStack_a0;
  double cubic [3] [4];
  
  if (this->m_area_status == '\0') {
    this->m_area_estimate = ON_DBL_QNAN;
    this->m_area_status = '\a';
    OVar5 = Internal_FigureEndDex(this,false);
    if (OVar5 != 0) {
      pOVar2 = (this->m_points).m_a;
      figure_start.m_point.y = (pOVar2->m_point).y;
      figure_start.m_point_type = pOVar2->m_point_type;
      figure_start.m_point_proximity = pOVar2->m_point_proximity;
      figure_start.m_figure_index = pOVar2->m_figure_index;
      figure_start.m_point.x = (pOVar2->m_point).x;
      if (((OVar5 < 3) || (figure_start.m_point_type == BeginFigureOpen)) ||
         (pOVar2[OVar5].m_point_type == EndFigureOpen)) {
        this->m_area_estimate = 0.0;
        this->m_area_status = '\x01';
      }
      else {
        quad[0][0] = -1.23432101234321e+308;
        cubic[0][0] = -1.23432101234321e+308;
        ON_2dPoint::operator=(&local_218,&figure_start.m_point);
        local_200 = 0.0;
        uVar9 = 1;
        while (uVar9 < OVar5) {
          p.m_point.y = pOVar2[uVar9].m_point.y;
          pOVar1 = pOVar2 + uVar9;
          p.m_point_type = pOVar1->m_point_type;
          p.m_point_proximity = pOVar1->m_point_proximity;
          p.m_figure_index = pOVar1->m_figure_index;
          p.m_point.x = (pOVar1->m_point).x;
          local_1f8 = SUB84(local_218.x,0);
          uStack_1f4 = (undefined4)((ulong)local_218.x >> 0x20);
          uStack_1f0 = SUB84(local_218.y,0);
          uStack_1ec = (undefined4)((ulong)local_218.y >> 0x20);
          ON_2dPoint::operator=(&local_218,&p.m_point);
          auVar3._4_4_ = uStack_1f4;
          auVar3._0_4_ = local_1f8;
          auVar3._8_4_ = uStack_1f0;
          auVar3._12_4_ = uStack_1ec;
          local_1c8._8_4_ = uStack_1f0;
          local_1c8._0_8_ = auVar3._8_8_;
          local_1c8._12_4_ = uStack_1ec;
          if (p.m_point_type == CubicBezierPoint) {
            bVar4 = ON_OutlineFigurePoint::IsOffFigure(&p);
            if (((!bVar4) || (uVar6 = uVar9 + 2, OVar5 <= uVar6)) ||
               (p.m_point_type != pOVar2[uVar9 + 1].m_point_type)) break;
            bVar4 = ON_OutlineFigurePoint::IsOffFigure(pOVar2 + (uVar9 + 1));
            if ((!bVar4) || (p.m_point_type != pOVar2[uVar6].m_point_type)) break;
            bVar4 = ON_OutlineFigurePoint::IsOnFigure(pOVar2 + uVar6);
            if (!bVar4) break;
            if ((cubic[0][0] == -1.23432101234321e+308) && (!NAN(cubic[0][0]))) {
              padVar8 = cubic;
              for (lVar11 = 1; lVar11 != 4; lVar11 = lVar11 + 1) {
                local_1e0 = (double)(int)lVar11 * 0.25;
                for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
                  dVar13 = ON_EvaluateBernsteinBasis(3,(int)lVar10,local_1e0);
                  (*padVar8)[lVar10] = dVar13;
                }
                padVar8 = padVar8 + 1;
              }
            }
            cv[1].x = local_218.x;
            cv[1].y = local_218.y;
            cv[0].x._0_4_ = local_1f8;
            cv[0].x._4_4_ = uStack_1f4;
            cv[0].y._0_4_ = uStack_1f0;
            cv[0].y._4_4_ = uStack_1ec;
            ON_2dPoint::operator=(cv + 2,&pOVar2[uVar9 + 1].m_point);
            ON_2dPoint::operator=(cv + 3,&pOVar2[uVar6].m_point);
            local_218.x = (double)CONCAT44(uStack_1f4,local_1f8);
            dVar13 = (double)CONCAT44(uStack_1ec,uStack_1f0);
            local_218.y = dVar13;
            for (lVar11 = 0x18; dVar12 = local_218.x, lVar11 != 0x78; lVar11 = lVar11 + 0x20) {
              local_1f8 = SUB84(local_218.x,0);
              uStack_1f4 = (undefined4)((ulong)local_218.x >> 0x20);
              uStack_1f0 = SUB84(dVar13,0);
              uStack_1ec = (undefined4)((ulong)dVar13 >> 0x20);
              OVar14 = ::operator*(*(double *)((long)quad[2] + lVar11 + 8),cv);
              local_190.y = OVar14.y;
              local_190.x = OVar14.x;
              OVar14 = ::operator*(*(double *)((long)quad[2] + lVar11 + 0x10),cv + 1);
              local_1a0.y = OVar14.y;
              local_1a0.x = OVar14.x;
              OVar14 = ON_2dPoint::operator+(&local_190,&local_1a0);
              local_180.y = OVar14.y;
              local_180.x = OVar14.x;
              OVar14 = ::operator*(*(double *)((long)&dStack_a0 + lVar11),cv + 2);
              local_138.y = OVar14.y;
              local_138.x = OVar14.x;
              OVar14 = ON_2dPoint::operator+(&local_180,&local_138);
              local_170.y = OVar14.y;
              local_170.x = OVar14.x;
              OVar14 = ::operator*(*(double *)((long)cubic[0] + lVar11),cv + 3);
              local_148.y = OVar14.y;
              local_148.x = OVar14.x;
              OVar14 = ON_2dPoint::operator+(&local_170,&local_148);
              local_218.y = OVar14.y;
              local_218.x = OVar14.x;
              local_200 = local_200 +
                          ((double)local_1c8._0_8_ + local_218.y) *
                          ((double)CONCAT44(uStack_1f4,local_1f8) - local_218.x);
              local_1c8._8_8_ = in_XMM1_Qb;
              local_1c8._0_8_ = local_218.y;
              dVar13 = (double)CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
            }
            local_218.x = cv[3].x;
            local_218.y = cv[3].y;
            dVar12 = dVar12 - cv[3].x;
          }
          else if (p.m_point_type == QuadraticBezierPoint) {
            bVar4 = ON_OutlineFigurePoint::IsOffFigure(&p);
            if (((!bVar4) || (uVar6 = uVar9 + 1, OVar5 <= uVar6)) ||
               (p.m_point_type != pOVar2[uVar6].m_point_type)) break;
            bVar4 = ON_OutlineFigurePoint::IsOnFigure(pOVar2 + uVar6);
            if (!bVar4) break;
            if ((quad[0][0] == -1.23432101234321e+308) && (!NAN(quad[0][0]))) {
              padVar7 = quad;
              for (lVar11 = 1; lVar11 != 4; lVar11 = lVar11 + 1) {
                local_1e0 = (double)(int)lVar11 * 0.25;
                for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                  dVar13 = ON_EvaluateBernsteinBasis(2,(int)lVar10,local_1e0);
                  (*padVar7)[lVar10] = dVar13;
                }
                padVar7 = padVar7 + 1;
              }
            }
            cv[1].x = local_218.x;
            cv[1].y = local_218.y;
            cv[0].x._0_4_ = local_1f8;
            cv[0].x._4_4_ = uStack_1f4;
            cv[0].y._0_4_ = uStack_1f0;
            cv[0].y._4_4_ = uStack_1ec;
            ON_2dPoint::operator=(cv + 2,&pOVar2[uVar6].m_point);
            local_218.x = (double)CONCAT44(uStack_1f4,local_1f8);
            dVar13 = (double)CONCAT44(uStack_1ec,uStack_1f0);
            local_218.y = dVar13;
            for (lVar11 = 0x10; dVar12 = local_218.x, lVar11 != 0x58; lVar11 = lVar11 + 0x18) {
              local_1f8 = SUB84(local_218.x,0);
              uStack_1f4 = (undefined4)((ulong)local_218.x >> 0x20);
              uStack_1f0 = SUB84(dVar13,0);
              uStack_1ec = (undefined4)((ulong)dVar13 >> 0x20);
              OVar14 = ::operator*(*(double *)((long)&cv[3].x + lVar11),cv);
              local_180.y = OVar14.y;
              local_180.x = OVar14.x;
              OVar14 = ::operator*(*(double *)((long)&cv[3].y + lVar11),cv + 1);
              local_190.y = OVar14.y;
              local_190.x = OVar14.x;
              OVar14 = ON_2dPoint::operator+(&local_180,&local_190);
              local_170.y = OVar14.y;
              local_170.x = OVar14.x;
              OVar14 = ::operator*(*(double *)((long)quad[0] + lVar11),cv + 2);
              local_1a0.y = OVar14.y;
              local_1a0.x = OVar14.x;
              OVar14 = ON_2dPoint::operator+(&local_170,&local_1a0);
              local_218.y = OVar14.y;
              local_218.x = OVar14.x;
              local_200 = local_200 +
                          ((double)local_1c8._0_8_ + local_218.y) *
                          ((double)CONCAT44(uStack_1f4,local_1f8) - local_218.x);
              local_1c8._8_8_ = in_XMM1_Qb;
              local_1c8._0_8_ = local_218.y;
              dVar13 = (double)CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
            }
            local_218.x = cv[2].x;
            local_218.y = cv[2].y;
            dVar12 = dVar12 - cv[2].x;
          }
          else {
            if (p.m_point_type != LineTo) break;
            dVar12 = (double)CONCAT44(uStack_1f4,local_1f8) - local_218.x;
            uVar6 = uVar9;
          }
          local_200 = local_200 + ((double)local_1c8._0_8_ + local_218.y) * dVar12;
          in_XMM1_Qb = local_1c8._8_8_;
          uVar9 = uVar6 + 1;
        }
        if (uVar9 == OVar5) {
          local_1f8 = SUB84(local_218.x,0);
          uStack_1f4 = (undefined4)((ulong)local_218.x >> 0x20);
          local_1e0 = local_218.y;
          ON_2dPoint::operator=(&local_218,&figure_start.m_point);
          this->m_area_estimate =
               (local_200 +
               (local_1e0 + local_218.y) * ((double)CONCAT44(uStack_1f4,local_1f8) - local_218.x)) *
               0.5;
          this->m_area_status = '\x01';
          goto LAB_004ac078;
        }
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
                   ,0x479,"","Area calculation failed.");
      }
      if ((this->m_figure_type < 5) && ((0x13U >> (this->m_figure_type & 0x1f) & 1) != 0)) {
        this->m_figure_type = NotPerimeter;
      }
    }
  }
LAB_004ac078:
  return this->m_area_estimate;
}

Assistant:

double ON_OutlineFigure::AreaEstimate() const
{
  while (0 == m_area_status)
  {
    m_area_estimate = ON_DBL_QNAN;
    m_area_status = 7;

    const ON__UINT32 figure_end_dex = Internal_FigureEndDex(false);
    if (0 == figure_end_dex)
      break;

    const ON_OutlineFigurePoint* a = m_points.Array();

    const ON_OutlineFigurePoint figure_start = a[0];
    const ON_OutlineFigurePoint figure_end = a[figure_end_dex];

    if (
      ON_OutlineFigurePoint::Type::BeginFigureOpen == figure_start.m_point_type
      || ON_OutlineFigurePoint::Type::EndFigureOpen == figure_end.m_point_type
      || figure_end_dex <= 2
      )
    {
      m_area_estimate = 0.0;
      m_area_status = 1;
      if (
        ON_OutlineFigure::Type::Perimeter == m_figure_type
        || ON_OutlineFigure::Type::Unset == m_figure_type
        || ON_OutlineFigure::Type::Unknown == m_figure_type
        )
      {
        m_figure_type = ON_OutlineFigure::Type::NotPerimeter;
      }
      break;
    }

    ON_2dPoint cv[4], p0, p1;

    double quad[3][3];
    double cubic[3][4];

    quad[0][0] = ON_UNSET_VALUE;
    cubic[0][0] = ON_UNSET_VALUE;
    double twice_area = 0.0;

    p1 = figure_start.m_point;
    ON__UINT32 i;
    for ( i = 1; i < figure_end_dex; i++)
    {
      const ON_OutlineFigurePoint p = a[i];
      p0 = p1;
      p1 = p.m_point;

      if (ON_OutlineFigurePoint::Type::LineTo == p.m_point_type)
      {
        twice_area += Internal_DeltaArea(p0, p1);
        continue;
      }

      if (ON_OutlineFigurePoint::Type::QuadraticBezierPoint == p.m_point_type)
      {
        if (
          p.IsOffFigure()
          && i + 1 < figure_end_dex
          && p.m_point_type == a[i + 1].m_point_type
          &&  a[i + 1].IsOnFigure()
          )
        {
          // approximate quadratic with 4 line segments
          if (ON_UNSET_VALUE == quad[0][0])
          {
            for (int tdex = 1; tdex <= 3; tdex++)
            {
              const double t = 0.25 * tdex;
              //const double s = 1.0 - t;
              for (int cvdex = 0; cvdex < 3; cvdex++)
              {
                quad[tdex - 1][cvdex] = ON_EvaluateBernsteinBasis(2, cvdex, t);
              }
            }
          }
          cv[0] = p0;
          cv[1] = p1;
          cv[2] = a[++i].m_point;
          p1 = p0;
          for (int j = 0; j < 3; j++)
          {
            p0 = p1;
            p1 = quad[j][0] * cv[0] + quad[j][1] * cv[1] + quad[j][2] * cv[2];
            twice_area += Internal_DeltaArea(p0, p1);
          }
          p0 = p1;
          p1 = cv[2];
          twice_area += Internal_DeltaArea(p0, p1);
          continue;
        }
        // error
        break;
      }

      if (ON_OutlineFigurePoint::Type::CubicBezierPoint == p.m_point_type)
      {
        if (
          // approximate cubic with 4 line segments
          p.IsOffFigure()
          && i + 2 < figure_end_dex
          && p.m_point_type == a[i + 1].m_point_type
          && a[i + 1].IsOffFigure()
          && p.m_point_type == a[i + 2].m_point_type
          && a[i + 2].IsOnFigure()
          )
        {
          if (ON_UNSET_VALUE == cubic[0][0])
          {
            for (int tdex = 1; tdex <= 3; tdex++)
            {
              const double t = 0.25 * tdex;
              //const double s = 1.0 - t;
              for (int cvdex = 0; cvdex < 4; cvdex++)
              {
                cubic[tdex - 1][cvdex] = ON_EvaluateBernsteinBasis(3, cvdex, t);
              }
            }
          }
          cv[0] = p0;
          cv[1] = p1;
          cv[2] = a[++i].m_point;
          cv[3] = a[++i].m_point;
          p1 = p0;
          for (int j = 0; j < 3; j++)
          {
            p0 = p1;
            p1 = cubic[j][0] * cv[0] + cubic[j][1] * cv[1] + cubic[j][2] * cv[2] + cubic[j][3] * cv[3];
            twice_area += Internal_DeltaArea(p0, p1);
          }
          p0 = p1;
          p1 = cv[3];
          twice_area += Internal_DeltaArea(p0, p1);
          continue;
        }
        // error
        break;
      }

      break;
    }

    if (i != figure_end_dex)
    {
      ON_ERROR("Area calculation failed.");
      if (
        ON_OutlineFigure::Type::Perimeter == m_figure_type
        || ON_OutlineFigure::Type::Unset == m_figure_type
        || ON_OutlineFigure::Type::Unknown == m_figure_type
        )
      {
        m_figure_type = ON_OutlineFigure::Type::NotPerimeter;
      }
      break; // error
    }

    p0 = p1;
    p1 = figure_start.m_point;
    twice_area += Internal_DeltaArea(p0, p1);

    m_area_estimate = 0.5*twice_area;
    m_area_status = 1;
    break;
  }

  return m_area_estimate;
}